

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbsptree.cpp
# Opt level: O0

int __thiscall QBspTree::init(QBspTree *this,EVP_PKEY_CTX *ctx)

{
  reference pNVar1;
  Type in_ECX;
  uint in_EDX;
  int in_R8D;
  long in_FS_OFFSET;
  int idx;
  Type t;
  QRect back;
  QRect front;
  QPoint center;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int local_64;
  Type TVar2;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ECX == Both) && (in_ECX = VerticalPlane, (in_EDX & 1) != 0)) {
    in_ECX = HorizontalPlane;
  }
  local_10 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QRect::center((QRect *)CONCAT44(in_R8D,in_ECX));
  if (in_ECX == VerticalPlane) {
    local_64 = QPoint::x((QPoint *)0x82ed07);
  }
  else {
    local_64 = QPoint::y((QPoint *)0x82ed17);
  }
  pNVar1 = QList<QBspTree::Node>::operator[]
                     ((QList<QBspTree::Node> *)CONCAT44(local_64,in_stack_ffffffffffffff90),
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  pNVar1->pos = local_64;
  TVar2 = in_ECX;
  pNVar1 = QList<QBspTree::Node>::operator[]
                     ((QList<QBspTree::Node> *)CONCAT44(local_64,in_stack_ffffffffffffff90),
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  pNVar1->type = in_ECX;
  local_20 = *(undefined8 *)ctx;
  local_18 = *(undefined8 *)(ctx + 8);
  local_30 = *(undefined8 *)ctx;
  local_28 = *(undefined8 *)(ctx + 8);
  if (TVar2 == VerticalPlane) {
    QPoint::x((QPoint *)0x82edcb);
    QRect::setLeft((QRect *)CONCAT44(local_64,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c);
    QPoint::x((QPoint *)0x82ede1);
    QRect::setRight((QRect *)CONCAT44(local_64,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c)
    ;
  }
  else {
    QPoint::y((QPoint *)0x82edfc);
    QRect::setTop((QRect *)CONCAT44(local_64,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c);
    QPoint::y((QPoint *)0x82ee12);
    QRect::setBottom((QRect *)CONCAT44(local_64,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c
                    );
  }
  firstChildIndex(this,in_R8D);
  if (in_EDX != 1) {
    init(this,(EVP_PKEY_CTX *)&local_30);
    init(this,(EVP_PKEY_CTX *)&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QBspTree::init(const QRect &area, int depth, NodeType type, int index)
{
    Node::Type t = Node::None; // t should never have this value
    if (type == Node::Both) // if both planes are specified, use 2d bsp
        t = (depth & 1) ? Node::HorizontalPlane : Node::VerticalPlane;
    else
        t = type;
    QPoint center = area.center();
    nodes[index].pos = (t == Node::VerticalPlane ? center.x() : center.y());
    nodes[index].type = t;

    QRect front = area;
    QRect back = area;

    if (t == Node::VerticalPlane) {
        front.setLeft(center.x());
        back.setRight(center.x() - 1); // front includes the center
    } else { // t == Node::HorizontalPlane
        front.setTop(center.y());
        back.setBottom(center.y() - 1);
    }

    int idx = firstChildIndex(index);
    if (--depth) {
        init(back, depth, type, idx);
        init(front, depth, type, idx + 1);
    }
}